

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.h
# Opt level: O1

void __thiscall google::protobuf::MapValueRef::SetDoubleValue(MapValueRef *this,double value)

{
  CppType CVar1;
  LogMessage *pLVar2;
  LogFinisher local_59;
  double local_58;
  LogMessage local_50;
  
  local_58 = value;
  CVar1 = type(this);
  if (CVar1 != CPPTYPE_DOUBLE) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/map_field.h"
               ,0x25b);
    pLVar2 = internal::LogMessage::operator<<(&local_50,"Protocol Buffer map usage error:\n");
    pLVar2 = internal::LogMessage::operator<<(pLVar2,"MapValueRef::SetDoubleValue");
    pLVar2 = internal::LogMessage::operator<<(pLVar2," type does not match\n");
    pLVar2 = internal::LogMessage::operator<<(pLVar2,"  Expected : ");
    pLVar2 = internal::LogMessage::operator<<(pLVar2,(char *)0x30cafa);
    pLVar2 = internal::LogMessage::operator<<(pLVar2,"\n");
    pLVar2 = internal::LogMessage::operator<<(pLVar2,"  Actual   : ");
    CVar1 = type(this);
    pLVar2 = internal::LogMessage::operator<<
                       (pLVar2,*(char **)(FieldDescriptor::kCppTypeToName + (ulong)CVar1 * 8));
    internal::LogFinisher::operator=(&local_59,pLVar2);
    internal::LogMessage::~LogMessage(&local_50);
  }
  *(double *)this->data_ = local_58;
  return;
}

Assistant:

void SetDoubleValue(double value) {
    TYPE_CHECK(FieldDescriptor::CPPTYPE_DOUBLE, "MapValueRef::SetDoubleValue");
    *reinterpret_cast<double*>(data_) = value;
  }